

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfOutputFile.cpp
# Opt level: O3

void __thiscall Imf_2_5::anon_unknown_7::LineBufferTask::execute(LineBufferTask *this)

{
  int *piVar1;
  _Base_ptr p_Var2;
  ulong uVar3;
  long *plVar4;
  undefined8 uVar5;
  uint uVar6;
  int iVar7;
  void *pvVar8;
  pointer ppLVar9;
  char *pcVar10;
  Compression *pCVar11;
  Compressor *pCVar12;
  ulong uVar13;
  ulong uVar14;
  Data *pDVar15;
  LineBuffer *pLVar16;
  long lVar17;
  long lVar18;
  uint uVar19;
  uint uVar20;
  pointer ppLVar21;
  int iVar22;
  LineBuffer *pLVar23;
  long lVar24;
  ulong *puVar25;
  long lVar26;
  long lVar27;
  uint uVar28;
  char *pcVar29;
  bool bVar30;
  char *writePtr;
  char *compPtr;
  char *local_50;
  int local_44;
  char *local_40;
  char *local_38;
  
  pDVar15 = this->_ofd;
  pLVar16 = this->_lineBuffer;
  if (*(int *)&(pDVar15->bytesPerLine).
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish == 0) {
    uVar20 = *(uint *)&(pLVar16->_sem)._vptr_Semaphore;
    uVar6 = *(uint *)((long)&(pLVar16->_sem)._vptr_Semaphore + 4);
    uVar28 = uVar6 + 1;
    local_44 = 1;
    uVar19 = uVar20;
  }
  else {
    uVar20 = *(uint *)&(pLVar16->_sem)._vptr_Semaphore;
    uVar6 = *(uint *)((long)&(pLVar16->_sem)._vptr_Semaphore + 4);
    uVar28 = uVar20 - 1;
    local_44 = -1;
    uVar19 = uVar6;
  }
  bytesPerDeepLineTable
            (&pDVar15->header,uVar20,uVar6,*(char **)&pDVar15[1].header._map._M_t._M_impl,
             pDVar15[1].header._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color,
             *(int *)&pDVar15[1].header._map._M_t._M_impl.super__Rb_tree_header._M_header.field_0x4,
             (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&pDVar15->slices);
  pLVar16 = this->_lineBuffer;
  iVar7 = *(int *)&(pLVar16->_sem)._vptr_Semaphore;
  if (iVar7 <= *(int *)((long)&(pLVar16->_sem)._vptr_Semaphore + 4)) {
    pDVar15 = this->_ofd;
    lVar18 = (long)iVar7;
    do {
      puVar25 = (ulong *)((pLVar16->buffer)._data +
                         (lVar18 - *(int *)((long)&(pLVar16->exception).field_2 + 8)) * 0x10);
      uVar14 = *(ulong *)((long)(pDVar15->slices).
                                super__Vector_base<Imf_2_5::(anonymous_namespace)::OutSliceInfo,_std::allocator<Imf_2_5::(anonymous_namespace)::OutSliceInfo>_>
                                ._M_impl.super__Vector_impl_data._M_start +
                         (lVar18 - *(int *)((long)&(pDVar15->bytesPerLine).
                                                                                                      
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                           + 4)) * 8);
      pvVar8 = operator_new__(uVar14);
      if ((void *)puVar25[1] != (void *)0x0) {
        operator_delete__((void *)puVar25[1]);
        pDVar15 = this->_ofd;
      }
      *puVar25 = uVar14;
      puVar25[1] = (ulong)pvVar8;
      iVar7 = *(int *)((long)&(pDVar15->bytesPerLine).
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_finish + 4);
      if (iVar7 <= *(int *)&(pDVar15->bytesPerLine).
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage) {
        lVar26 = *(long *)&pDVar15[1].header._map._M_t._M_impl;
        p_Var2 = pDVar15[1].header._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        lVar27 = (long)iVar7;
        do {
          piVar1 = (int *)((long)p_Var2 +
                          (lVar18 - *(int *)((long)&(pDVar15->bytesPerLine).
                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                            + 4)) * 4);
          *piVar1 = *piVar1 + *(int *)((int)pDVar15[1].header._map._M_t._M_impl.
                                            super__Rb_tree_header._M_header._M_color * lVar27 +
                                      *(int *)&pDVar15[1].header._map._M_t._M_impl.
                                               super__Rb_tree_header._M_header.field_0x4 * lVar18 +
                                      lVar26);
          bVar30 = lVar27 < *(int *)&(pDVar15->bytesPerLine).
                                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage;
          lVar27 = lVar27 + 1;
        } while (bVar30);
      }
      pLVar16 = this->_lineBuffer;
      bVar30 = lVar18 < *(int *)((long)&(pLVar16->_sem)._vptr_Semaphore + 4);
      lVar18 = lVar18 + 1;
    } while (bVar30);
  }
  if (uVar19 != uVar28) {
    pDVar15 = this->_ofd;
    do {
      local_50 = *(char **)((this->_lineBuffer->buffer)._data +
                           ((long)(int)uVar19 -
                           (long)*(int *)((long)&(this->_lineBuffer->exception).field_2 + 8)) * 0x10
                           + 8);
      ppLVar9 = (pDVar15->lineBuffers).
                super__Vector_base<Imf_2_5::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::LineBuffer_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if ((pDVar15->lineBuffers).
          super__Vector_base<Imf_2_5::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::LineBuffer_*>_>
          ._M_impl.super__Vector_impl_data._M_finish != ppLVar9) {
        uVar14 = 0;
        uVar13 = 1;
        do {
          pLVar16 = ppLVar9[uVar14];
          uVar20 = pLVar16->maxY;
          if ((int)uVar19 < 0) {
            if (-1 < (int)uVar20) {
              uVar6 = (uVar20 + ~uVar19) / uVar20;
              goto LAB_001fd43b;
            }
            uVar6 = (~uVar20 - uVar19) / -uVar20;
          }
          else if ((int)uVar20 < 0) {
            uVar6 = uVar19 / -uVar20;
LAB_001fd43b:
            uVar6 = -uVar6;
          }
          else {
            uVar6 = uVar19 / uVar20;
          }
          if (uVar19 == uVar6 * uVar20) {
            if ((char)pLVar16->scanLineMin == '\x01') {
              fillChannelWithZeroes
                        (&local_50,(Format)pDVar15->lineOffsetsPosition,
                         (PixelType)(pLVar16->buffer)._size,
                         (ulong)*(uint *)((long)pDVar15[1].header._map._M_t._M_impl.
                                                super__Rb_tree_header._M_header._M_left +
                                         ((long)(int)uVar19 -
                                         (long)*(int *)((long)&(pDVar15->bytesPerLine).
                                                                                                                              
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  + 4)) * 4));
            }
            else {
              copyFromDeepFrameBuffer
                        (&local_50,(pLVar16->buffer)._data,
                         *(char **)&pDVar15[1].header._map._M_t._M_impl,
                         (long)(int)pDVar15[1].header._map._M_t._M_impl.super__Rb_tree_header.
                                    _M_header._M_color,
                         (long)*(int *)&pDVar15[1].header._map._M_t._M_impl.super__Rb_tree_header.
                                        _M_header.field_0x4,uVar19,
                         *(int *)((long)&(pDVar15->bytesPerLine).
                                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                         ._M_impl.super__Vector_impl_data._M_finish + 4),
                         *(int *)&(pDVar15->bytesPerLine).
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage,0,0,0,0,
                         (ptrdiff_t)pLVar16->dataPtr,*(ptrdiff_t *)&pLVar16->dataSize,
                         (ptrdiff_t)pLVar16->endOfLineBufferData,
                         (Format)pDVar15->lineOffsetsPosition,(PixelType)(pLVar16->buffer)._size);
            }
          }
          pDVar15 = this->_ofd;
          ppLVar9 = (pDVar15->lineBuffers).
                    super__Vector_base<Imf_2_5::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::LineBuffer_*>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          bVar30 = uVar13 < (ulong)((long)(pDVar15->lineBuffers).
                                          super__Vector_base<Imf_2_5::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::LineBuffer_*>_>
                                          ._M_impl.super__Vector_impl_data._M_finish - (long)ppLVar9
                                   >> 3);
          uVar14 = uVar13;
          uVar13 = (ulong)((int)uVar13 + 1);
        } while (bVar30);
      }
      uVar19 = uVar19 + local_44;
    } while (uVar19 != uVar28);
    pLVar16 = this->_lineBuffer;
  }
  iVar7 = *(int *)((long)&(pLVar16->exception).field_2 + 8);
  iVar22 = *(int *)((long)&(pLVar16->exception).field_2 + 0xc);
  if ((iVar7 <= (int)uVar28) && ((int)uVar28 <= iVar22)) {
    return;
  }
  if (iVar22 < iVar7) {
    pcVar29 = (char *)0x0;
    uVar14 = 0;
  }
  else {
    puVar25 = (ulong *)(pLVar16->buffer)._data;
    uVar13 = (ulong)((iVar22 - iVar7) + 1);
    uVar14 = 0;
    pcVar29 = (char *)0x0;
    do {
      uVar3 = *puVar25;
      pcVar29 = pcVar29 + uVar3;
      if (uVar14 < uVar3) {
        uVar14 = uVar3;
      }
      puVar25 = puVar25 + 2;
      uVar13 = uVar13 - 1;
    } while (uVar13 != 0);
  }
  pvVar8 = operator_new__((ulong)pcVar29);
  pLVar23 = pLVar16;
  if (*(void **)&pLVar16->dataSize != (void *)0x0) {
    operator_delete__(*(void **)&pLVar16->dataSize);
    pLVar23 = this->_lineBuffer;
  }
  pLVar16->dataPtr = pcVar29;
  *(void **)&pLVar16->dataSize = pvVar8;
  iVar7 = *(int *)((long)&(pLVar23->exception).field_2 + 8);
  iVar22 = *(int *)((long)&(pLVar23->exception).field_2 + 0xc);
  if (iVar7 <= iVar22) {
    pcVar10 = (pLVar23->buffer)._data;
    lVar18 = -1;
    lVar26 = 0;
    lVar27 = 0;
    do {
      memcpy((void *)(*(long *)&pLVar23->dataSize + (long)(int)lVar27),
             *(void **)(pcVar10 + lVar26 + 8),*(size_t *)(pcVar10 + lVar26));
      pLVar23 = this->_lineBuffer;
      pcVar10 = (pLVar23->buffer)._data;
      lVar27 = (long)(int)lVar27 + *(long *)(pcVar10 + lVar26);
      iVar22 = *(int *)((long)&(pLVar23->exception).field_2 + 0xc);
      iVar7 = *(int *)((long)&(pLVar23->exception).field_2 + 8);
      lVar18 = lVar18 + 1;
      lVar26 = lVar26 + 0x10;
    } while (lVar18 < iVar22 - iVar7);
  }
  pLVar23->endOfLineBufferData = *(char **)&pLVar23->dataSize;
  *(char **)&pLVar23->scanLineMin = pcVar29;
  *(char **)&pLVar23->minY = pcVar29;
  if (iVar22 < iVar7) {
    uVar13 = 0;
  }
  else {
    lVar18._0_1_ = pLVar23->partiallyFull;
    lVar18._1_1_ = pLVar23->hasException;
    lVar18._2_6_ = *(undefined6 *)&pLVar23->field_0x42;
    pDVar15 = this->_ofd;
    uVar13 = 0;
    lVar26 = (long)iVar7;
    do {
      iVar7 = *(int *)((long)&(pDVar15->bytesPerLine).
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_finish + 4);
      if (iVar7 <= *(int *)&(pDVar15->bytesPerLine).
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage) {
        iVar22 = 0;
        lVar27 = (long)iVar7;
        do {
          lVar17 = lVar18;
          iVar22 = iVar22 + *(int *)((int)pDVar15[1].header._map._M_t._M_impl.super__Rb_tree_header.
                                          _M_header._M_color * lVar27 +
                                    *(int *)&pDVar15[1].header._map._M_t._M_impl.
                                             super__Rb_tree_header._M_header.field_0x4 * lVar26 +
                                    *(long *)&pDVar15[1].header._map._M_t._M_impl);
          local_50 = (char *)CONCAT44(local_50._4_4_,iVar22);
          lVar24 = 0;
          do {
            *(undefined1 *)(lVar17 + lVar24) = *(undefined1 *)((long)&local_50 + lVar24);
            lVar24 = lVar24 + 1;
          } while ((int)lVar24 != 4);
          uVar13 = uVar13 + 4;
          pDVar15 = this->_ofd;
          bVar30 = lVar27 < *(int *)&(pDVar15->bytesPerLine).
                                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage;
          lVar18 = lVar17 + lVar24;
          lVar27 = lVar27 + 1;
        } while (bVar30);
        pLVar23 = this->_lineBuffer;
        lVar18 = lVar17 + lVar24;
      }
      bVar30 = lVar26 < *(int *)((long)&(pLVar23->exception).field_2 + 0xc);
      lVar26 = lVar26 + 1;
    } while (bVar30);
  }
  plVar4 = (long *)(pLVar23->exception).field_2._M_allocated_capacity;
  if (plVar4 != (long *)0x0) {
    uVar5._0_1_ = pLVar23->partiallyFull;
    uVar5._1_1_ = pLVar23->hasException;
    uVar5._2_6_ = *(undefined6 *)&pLVar23->field_0x42;
    iVar7 = (**(code **)(*plVar4 + 0x20))
                      (plVar4,uVar5,uVar13 & 0xffffffff,
                       *(undefined4 *)((long)&(pLVar23->exception).field_2 + 8),&pLVar23->exception)
    ;
    pLVar23 = this->_lineBuffer;
    (pLVar23->exception)._M_string_length = (long)iVar7;
    if (((pLVar23->exception).field_2._M_allocated_capacity != 0) &&
       ((pLVar23->exception)._M_string_length < uVar13)) goto LAB_001fd704;
  }
  (pLVar23->exception)._M_string_length = uVar13;
  (pLVar23->exception)._M_dataplus._M_p = *(pointer *)&pLVar23->partiallyFull;
LAB_001fd704:
  plVar4 = (long *)(pLVar23->_sem)._semaphore.__align;
  if (plVar4 != (long *)0x0) {
    (**(code **)(*plVar4 + 8))();
  }
  pCVar11 = Header::compression(&this->_ofd->header);
  pCVar12 = newCompressor(*pCVar11,uVar14,&this->_ofd->header);
  pLVar16 = this->_lineBuffer;
  *(Compressor **)&(pLVar16->_sem)._semaphore = pCVar12;
  if (pCVar12 != (Compressor *)0x0) {
    iVar7 = (*pCVar12->_vptr_Compressor[4])
                      (pCVar12,pLVar16->endOfLineBufferData,(ulong)(uint)pLVar16->scanLineMin,
                       (ulong)*(uint *)((long)&(pLVar16->exception).field_2 + 8),&local_40);
    uVar13 = (ulong)iVar7;
    pLVar16 = this->_lineBuffer;
    uVar14._0_4_ = pLVar16->scanLineMin;
    uVar14._4_4_ = pLVar16->scanLineMax;
    if (uVar13 < uVar14) {
      pLVar16->scanLineMin = (int)uVar13;
      pLVar16->scanLineMax = (int)(uVar13 >> 0x20);
      pLVar16->endOfLineBufferData = local_40;
    }
    else {
      pDVar15 = this->_ofd;
      if ((int)pDVar15->lineOffsetsPosition == 0) {
        uVar28 = *(uint *)((long)&(pLVar16->exception).field_2 + 8);
        uVar20 = *(uint *)((long)&(pLVar16->exception).field_2 + 0xc);
        local_50 = *(char **)&pLVar16->dataSize;
        if ((int)uVar28 <= (int)uVar20) {
          ppLVar9 = (pDVar15->lineBuffers).
                    super__Vector_base<Imf_2_5::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::LineBuffer_*>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          ppLVar21 = (pDVar15->lineBuffers).
                     super__Vector_base<Imf_2_5::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::LineBuffer_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
          do {
            local_38 = local_50;
            if (ppLVar21 != ppLVar9) {
              uVar14 = 0;
              uVar13 = 1;
              do {
                uVar6 = ppLVar9[uVar14]->maxY;
                if ((int)uVar28 < 0) {
                  if (-1 < (int)uVar6) {
                    uVar19 = (uVar6 + ~uVar28) / uVar6;
                    goto LAB_001fd80f;
                  }
                  uVar19 = (~uVar6 - uVar28) / -uVar6;
                }
                else if ((int)uVar6 < 0) {
                  uVar19 = uVar28 / -uVar6;
LAB_001fd80f:
                  uVar19 = -uVar19;
                }
                else {
                  uVar19 = uVar28 / uVar6;
                }
                if (uVar28 == uVar19 * uVar6) {
                  convertInPlace(&local_50,&local_38,(PixelType)(ppLVar9[uVar14]->buffer)._size,
                                 (long)*(int *)((long)pDVar15[1].header._map._M_t._M_impl.
                                                      super__Rb_tree_header._M_header._M_left +
                                               ((long)(int)uVar28 -
                                               (long)*(int *)((long)&(pDVar15->bytesPerLine).
                                                                                                                                          
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  + 4)) * 4));
                  ppLVar9 = (pDVar15->lineBuffers).
                            super__Vector_base<Imf_2_5::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::LineBuffer_*>_>
                            ._M_impl.super__Vector_impl_data._M_start;
                  ppLVar21 = (pDVar15->lineBuffers).
                             super__Vector_base<Imf_2_5::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::LineBuffer_*>_>
                             ._M_impl.super__Vector_impl_data._M_finish;
                }
                bVar30 = uVar13 < (ulong)((long)ppLVar21 - (long)ppLVar9 >> 3);
                uVar14 = uVar13;
                uVar13 = (ulong)((int)uVar13 + 1);
              } while (bVar30);
            }
            bVar30 = uVar28 != uVar20;
            uVar28 = uVar28 + 1;
          } while (bVar30);
          pLVar16 = this->_lineBuffer;
        }
      }
    }
  }
  (pLVar16->_sem)._semaphore.__size[8] = '\0';
  return;
}

Assistant:

void
LineBufferTask::execute ()
{
    try
    {
        //
        // First copy the pixel data from the
	// frame buffer into the line buffer
        //
        
        int yStart, yStop, dy;

        if (_ofd->lineOrder == INCREASING_Y)
        {
            yStart = _lineBuffer->scanLineMin;
            yStop = _lineBuffer->scanLineMax + 1;
            dy = 1;
        }
        else
        {
            yStart = _lineBuffer->scanLineMax;
            yStop = _lineBuffer->scanLineMin - 1;
            dy = -1;
        }
    
	int y;

        for (y = yStart; y != yStop; y += dy)
        {
            //
            // Gather one scan line's worth of pixel data and store
            // them in _ofd->lineBuffer.
            //
        
            char *writePtr = _lineBuffer->buffer +
                             _ofd->offsetInLineBuffer[y - _ofd->minY];
            //
            // Iterate over all image channels.
            //

            for (unsigned int i = 0; i < _ofd->slices.size(); ++i)
            {
                //
                // Test if scan line y of this channel contains any data
		// (the scan line contains data only if y % ySampling == 0).
                //
        
                const OutSliceInfo &slice = _ofd->slices[i];
        
                if (modp (y, slice.ySampling) != 0)
                    continue;
        
                //
                // Find the x coordinates of the leftmost and rightmost
                // sampled pixels (i.e. pixels within the data window
                // for which x % xSampling == 0).
                //
        
                int dMinX = divp (_ofd->minX, slice.xSampling);
                int dMaxX = divp (_ofd->maxX, slice.xSampling);
        
                //
		// Fill the line buffer with with pixel data.
                //
        
                if (slice.zero)
                {
                    //
                    // The frame buffer contains no data for this channel.
                    // Store zeroes in _lineBuffer->buffer.
                    //
                    
                    fillChannelWithZeroes (writePtr, _ofd->format, slice.type,
                                           dMaxX - dMinX + 1);
                }
                else
                {
                    //
                    // If necessary, convert the pixel data to Xdr format.
		    // Then store the pixel data in _ofd->lineBuffer.
                    //
        
                    const char *linePtr = slice.base +
                                          divp (y, slice.ySampling) *
                                          slice.yStride;
        
                    const char *readPtr = linePtr + dMinX * slice.xStride;
                    const char *endPtr  = linePtr + dMaxX * slice.xStride;
    
                    copyFromFrameBuffer (writePtr, readPtr, endPtr,
                                         slice.xStride, _ofd->format,
                                         slice.type);
                }
            }
        
            if (_lineBuffer->endOfLineBufferData < writePtr)
                _lineBuffer->endOfLineBufferData = writePtr;
        
            #ifdef DEBUG
        
                assert (writePtr - (_lineBuffer->buffer +
                        _ofd->offsetInLineBuffer[y - _ofd->minY]) ==
                        (int) _ofd->bytesPerLine[y - _ofd->minY]);
        
            #endif
        
        }
    
        //
        // If the next scanline isn't past the bounds of the lineBuffer
        // then we are done, otherwise compress the linebuffer
        //
    
        if (y >= _lineBuffer->minY && y <= _lineBuffer->maxY)
            return;
    
        _lineBuffer->dataPtr = _lineBuffer->buffer;

        _lineBuffer->dataSize = _lineBuffer->endOfLineBufferData -
                                _lineBuffer->buffer;
    
	//
        // Compress the data
	//

        Compressor *compressor = _lineBuffer->compressor;

        if (compressor)
        {
            const char *compPtr;

            int compSize = compressor->compress (_lineBuffer->dataPtr,
                                                 _lineBuffer->dataSize,
                                                 _lineBuffer->minY, compPtr);
    
            if (compSize < _lineBuffer->dataSize)
            {
                _lineBuffer->dataSize = compSize;
                _lineBuffer->dataPtr = compPtr;
            }
            else if (_ofd->format == Compressor::NATIVE)
            {
                //
                // The data did not shrink during compression, but
                // we cannot write to the file using the machine's
                // native format, so we need to convert the lineBuffer
                // to Xdr.
                //
    
                convertToXdr (_ofd, _lineBuffer->buffer, _lineBuffer->minY,
                              _lineBuffer->maxY, _lineBuffer->dataSize);
            }
        }

        _lineBuffer->partiallyFull = false;
    }
    catch (std::exception &e)
    {
        if (!_lineBuffer->hasException)
        {
            _lineBuffer->exception = e.what ();
            _lineBuffer->hasException = true;
        }
    }
    catch (...)
    {
        if (!_lineBuffer->hasException)
        {
            _lineBuffer->exception = "unrecognized exception";
            _lineBuffer->hasException = true;
        }
    }
}